

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O0

void __thiscall
glcts::DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior::setUpTestCases
          (DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior *this)

{
  long lVar1;
  bool bVar2;
  RenderContext *pRVar3;
  byte bVar4;
  undefined1 local_120 [8];
  _test_case new_test_case;
  GLuint *regular_multi_draw_call_offseted_array [3];
  GLuint regular_draw_call_offset;
  GLuint *multi_draw_call_indices_array [3];
  GLsizei multi_draw_call_count_array [3];
  bool use_vertex_attrib_binding;
  uint n_vertex_attrib_binding_status;
  uint n_vertex_attrib_binding_statuses;
  _function_type _Stack_4c;
  bool vertex_attrib_binding_statuses [2];
  uint n_basevertex_value;
  int n_function;
  GLuint *current_index_offset;
  uint n_index_offset;
  uint n_index_offsets;
  GLuint *index_offsets [2];
  uint local_20;
  bool use_clientside_index_data;
  bool use_clientside_vertex_data;
  int vao_iteration;
  uint n_basevertex_values;
  GLint basevertex_values [2];
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior *this_local;
  
  _vao_iteration = 10;
  basevertex_values = (GLint  [2])this;
  for (local_20 = 0; (int)local_20 < 2; local_20 = local_20 + 1) {
    index_offsets[1]._7_1_ = 0;
    index_offsets[1]._6_1_ = (local_20 & 1) != 0;
    pRVar3 = deqp::Context::getRenderContext
                       ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context);
    index_offsets[1]._0_4_ = (*pRVar3->_vptr_RenderContext[2])();
    bVar2 = glu::isContextTypeES((ContextType)index_offsets[1]._0_4_);
    if ((bVar2) || (((index_offsets[1]._6_1_ & 1) == 0 && ((index_offsets[1]._7_1_ & 1) == 0)))) {
      DrawElementsBaseVertexTestBase::computeVBODataOffsets
                (&this->super_DrawElementsBaseVertexTestBase,(bool)(index_offsets[1]._6_1_ & 1),
                 (bool)(index_offsets[1]._7_1_ & 1));
      _n_index_offset = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset;
      index_offsets[0] = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index2_offset;
      for (current_index_offset._0_4_ = 0; (uint)current_index_offset < 2;
          current_index_offset._0_4_ = (uint)current_index_offset + 1) {
        lVar1 = *(long *)(&n_index_offset + (ulong)(uint)current_index_offset * 2);
        for (_Stack_4c = FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX; (int)_Stack_4c < 4;
            _Stack_4c = _Stack_4c + FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX) {
          if ((((this->super_DrawElementsBaseVertexTestBase).m_is_ext_multi_draw_arrays_supported &
               1U) != 0) || (_Stack_4c != FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX)) {
            for (n_vertex_attrib_binding_statuses = 0; n_vertex_attrib_binding_statuses < 2;
                n_vertex_attrib_binding_statuses = n_vertex_attrib_binding_statuses + 1) {
              n_vertex_attrib_binding_status._2_2_ = 0x100;
              for (multi_draw_call_count_array[2] = 0; (uint)multi_draw_call_count_array[2] < 2;
                  multi_draw_call_count_array[2] = multi_draw_call_count_array[2] + 1) {
                bVar4 = *(byte *)((long)&n_vertex_attrib_binding_status +
                                 (ulong)(uint)multi_draw_call_count_array[2] + 2) & 1;
                if ((((this->super_DrawElementsBaseVertexTestBase).
                      m_is_vertex_attrib_binding_supported & 1U) != 0) || (bVar4 == 0)) {
                  new_test_case._112_8_ = lVar1 + 0x28;
                  DrawElementsBaseVertexTestBase::_test_case::_test_case((_test_case *)local_120);
                  local_120._0_4_ = (&vao_iteration)[n_vertex_attrib_binding_statuses];
                  local_120._4_4_ = _Stack_4c;
                  new_test_case.index_offset._4_4_ = 10;
                  if ((uint)current_index_offset == 0) {
                    new_test_case.index_offset._4_4_ = 0;
                  }
                  new_test_case.index_type = 0x20;
                  if ((uint)current_index_offset == 0) {
                    new_test_case.index_type = 0x16;
                  }
                  new_test_case.index_offset._0_4_ = 0x1405;
                  new_test_case.multi_draw_call_indices_array[2]._0_4_ = 4;
                  new_test_case.multi_draw_call_indices_array[2]._4_4_ = vao_iteration;
                  new_test_case.regular_multi_draw_call_offseted_array[2]._0_1_ =
                       local_120._0_4_ == vao_iteration;
                  new_test_case.regular_multi_draw_call_offseted_array[2]._1_1_ =
                       index_offsets[1]._6_1_ & 1;
                  new_test_case.regular_multi_draw_call_offseted_array[2]._2_1_ =
                       index_offsets[1]._7_1_ & 1;
                  new_test_case.regular_multi_draw_call_offseted_array[2]._3_1_ = 0;
                  new_test_case.regular_multi_draw_call_offseted_array[2]._4_1_ = 0;
                  new_test_case.range_start = 3;
                  new_test_case.range_end = 6;
                  new_test_case.multi_draw_call_count_array[0] = 3;
                  new_test_case._80_8_ = new_test_case._112_8_;
                  new_test_case._0_8_ = lVar1;
                  new_test_case.multi_draw_call_count_array._4_8_ = lVar1;
                  new_test_case.multi_draw_call_indices_array[0] = (GLuint *)(lVar1 + 0xc);
                  new_test_case.multi_draw_call_indices_array[1] = (GLuint *)(lVar1 + 0x24);
                  new_test_case.regular_multi_draw_call_offseted_array[0] =
                       (GLuint **)(lVar1 + 0x34);
                  new_test_case.regular_multi_draw_call_offseted_array[1] =
                       (GLuint **)(lVar1 + 0x4c);
                  new_test_case.regular_multi_draw_call_offseted_array[2]._5_1_ = bVar4;
                  std::
                  vector<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
                  ::push_back(&(this->super_DrawElementsBaseVertexTestBase).m_test_cases,
                              (value_type *)local_120);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior::setUpTestCases()
{
	/* Set up test case descriptors */
	const glw::GLint   basevertex_values[] = { 10, 0 };
	const unsigned int n_basevertex_values = sizeof(basevertex_values) / sizeof(basevertex_values[0]);

	/* The test needs to be run in two iterations, using client-side memory and buffer object
	 * for index data respectively
	 */
	for (int vao_iteration = 0; vao_iteration < 2; ++vao_iteration)
	{
		/* Skip client-side vertex array as gl_VertexID is undefined when no buffer bound to ARRAY_BUFFER
		 *  See section 11.1.3.9 in OpenGL ES 3.1 spec
		 */
		bool use_clientside_vertex_data = 0;
		bool use_clientside_index_data  = ((vao_iteration & (1 << 0)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Compute the offsets */
		computeVBODataOffsets(use_clientside_index_data, use_clientside_vertex_data);

		/* There are two index data sets we need to iterate over */
		const glw::GLuint* index_offsets[] = { m_draw_call_index_offset, m_draw_call_index2_offset };
		const unsigned int n_index_offsets = sizeof(index_offsets) / sizeof(index_offsets[0]);

		for (unsigned int n_index_offset = 0; n_index_offset < n_index_offsets; ++n_index_offset)
		{
			const glw::GLuint* current_index_offset = index_offsets[n_index_offset];

			/* We need to test four different functions:
			 *
			 * a)    glDrawElementsBaseVertex()             (GL)
			 *    or glDrawElementsBaseVertexEXT()          (ES)
			 * b)    glDrawRangeElementsBaseVertex()        (GL)
			 *    or glDrawRangeElementsBaseVertexEXT()     (ES)
			 * c)    glDrawElementsInstancedBaseVertex()    (GL)
			 *    or glDrawElementsInstancedBaseVertexEXT() (ES)
			 * d)    glMultiDrawElementsBaseVertex()        (GL)
			 *    or glMultiDrawElementsBaseVertexEXT()     (ES) (if supported)
			 **/
			for (int n_function = 0; n_function < FUNCTION_COUNT; ++n_function)
			{
				/* Do not try to use the multi draw call if relevant extension is
				 * not supported. */
				if (!m_is_ext_multi_draw_arrays_supported && n_function == FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX)
				{
					continue;
				}

				/* We need to run the test for a number of different basevertex values. */
				for (unsigned int n_basevertex_value = 0; n_basevertex_value < n_basevertex_values;
					 ++n_basevertex_value)
				{
					/* Finally, we want to verify that basevertex draw calls work correctly both when vertex attribute
					 * bindings are enabled and disabled */
					bool		 vertex_attrib_binding_statuses[] = { false, true };
					unsigned int n_vertex_attrib_binding_statuses =
						sizeof(vertex_attrib_binding_statuses) / sizeof(vertex_attrib_binding_statuses[0]);

					for (unsigned int n_vertex_attrib_binding_status = 0;
						 n_vertex_attrib_binding_status < n_vertex_attrib_binding_statuses;
						 ++n_vertex_attrib_binding_status)
					{
						bool use_vertex_attrib_binding = vertex_attrib_binding_statuses[n_vertex_attrib_binding_status];

						/* Under GL, "vertex attrib binding" functionality is only available if GL_ARB_vertex_attrib_binding
						 * extension is supported.
						 */
						if (!m_is_vertex_attrib_binding_supported && use_vertex_attrib_binding)
						{
							continue;
						}

						/* Prepare a few arrays so that we can handle the multi draw call and its emulated version.. */
						const glw::GLsizei multi_draw_call_count_array[3]   = { 3, 6, 3 };
						const glw::GLuint* multi_draw_call_indices_array[3] = {
							(glw::GLuint*)(current_index_offset), (glw::GLuint*)(current_index_offset + 3),
							(glw::GLuint*)(current_index_offset + 9)
						};

						/* Reference texture should always reflect basevertex=10 behavior. */
						const glw::GLuint  regular_draw_call_offset					 = basevertex_values[0];
						const glw::GLuint* regular_multi_draw_call_offseted_array[3] = {
							multi_draw_call_indices_array[0] + regular_draw_call_offset,
							multi_draw_call_indices_array[1] + regular_draw_call_offset,
							multi_draw_call_indices_array[2] + regular_draw_call_offset,
						};

						/* Construct the test case descriptor */
						_test_case new_test_case;

						new_test_case.basevertex			   = basevertex_values[n_basevertex_value];
						new_test_case.function_type			   = (_function_type)n_function;
						new_test_case.index_offset			   = current_index_offset;
						new_test_case.range_start			   = n_index_offset == 0 ? 0 : 10;
						new_test_case.range_end				   = n_index_offset == 0 ? 22 : 32;
						new_test_case.index_type			   = GL_UNSIGNED_INT;
						new_test_case.primitive_mode		   = GL_TRIANGLES;
						new_test_case.regular_draw_call_offset = basevertex_values[0];
						new_test_case.should_base_texture_match_reference_texture =
							((glw::GLuint)new_test_case.basevertex == new_test_case.regular_draw_call_offset);
						new_test_case.use_clientside_index_data		= use_clientside_index_data;
						new_test_case.use_clientside_vertex_data	= use_clientside_vertex_data;
						new_test_case.use_geometry_shader_stage		= false;
						new_test_case.use_tessellation_shader_stage = false;
						new_test_case.use_vertex_attrib_binding		= use_vertex_attrib_binding;

						memcpy(new_test_case.multi_draw_call_count_array, multi_draw_call_count_array,
							   sizeof(multi_draw_call_count_array));
						memcpy(new_test_case.multi_draw_call_indices_array, multi_draw_call_indices_array,
							   sizeof(multi_draw_call_indices_array));
						memcpy(new_test_case.regular_multi_draw_call_offseted_array,
							   regular_multi_draw_call_offseted_array, sizeof(regular_multi_draw_call_offseted_array));

						m_test_cases.push_back(new_test_case);
					} /* for (all vertex_attrib_binding statuses) */
				}	 /* for (all basevertex values) */
			}		  /* for (all four functions) */
		}			  /* for (all index data sets) */
	}				  /* for (all VAO iterations) */
}